

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_add_arc
               (plutovg_path_t *path,float cx,float cy,float r,float a0,float a1,_Bool ccw)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float y1;
  float fVar4;
  float cp2y;
  float cp2x;
  float cp1y;
  float cp1x;
  int i;
  float dy;
  float dx;
  float d;
  float seg_a;
  float ay;
  float ax;
  float a;
  int seg_n;
  float da;
  _Bool ccw_local;
  float a1_local;
  float a0_local;
  float r_local;
  float cy_local;
  float cx_local;
  plutovg_path_t *path_local;
  
  a = a1 - a0;
  if (ABS(a) <= 6.2831855) {
    if (((a != 0.0) || (NAN(a))) && (ccw != a < 0.0)) {
      iVar1 = 1;
      if (ccw) {
        iVar1 = -1;
      }
      a = (float)iVar1 * 6.2831855 + a;
    }
  }
  else {
    a = 6.2831855;
  }
  fVar2 = ceilf(ABS(a) / 1.5707964);
  iVar1 = (int)fVar2;
  if (iVar1 != 0) {
    fVar2 = cosf(a0);
    seg_a = fVar2 * r + cx;
    fVar2 = sinf(a0);
    d = fVar2 * r + cy;
    fVar2 = ((a / (float)iVar1) / 1.5707964) * 0.5522848 * r;
    fVar3 = sinf(a0);
    i = (int)(-fVar3 * fVar2);
    fVar3 = cosf(a0);
    cp1x = fVar3 * fVar2;
    plutovg_path_reserve(path,iVar1 * 4 + 2);
    if ((path->elements).size == 0) {
      plutovg_path_move_to(path,seg_a,d);
    }
    else {
      plutovg_path_line_to(path,seg_a,d);
    }
    ay = a0;
    for (cp1y = 0.0; (int)cp1y < iVar1; cp1y = (float)((int)cp1y + 1)) {
      fVar3 = seg_a + (float)i;
      y1 = d + cp1x;
      ay = a / (float)iVar1 + ay;
      fVar4 = cosf(ay);
      seg_a = fVar4 * r + cx;
      fVar4 = sinf(ay);
      d = fVar4 * r + cy;
      fVar4 = sinf(ay);
      i = (int)(-fVar4 * fVar2);
      fVar4 = cosf(ay);
      cp1x = fVar4 * fVar2;
      plutovg_path_cubic_to(path,fVar3,y1,seg_a - (float)i,d - cp1x,seg_a,d);
    }
  }
  return;
}

Assistant:

void plutovg_path_add_arc(plutovg_path_t* path, float cx, float cy, float r, float a0, float a1, bool ccw)
{
    float da = a1 - a0;
    if(fabsf(da) > PLUTOVG_TWO_PI) {
        da = PLUTOVG_TWO_PI;
    } else if(da != 0.f && ccw != (da < 0.f)) {
        da += PLUTOVG_TWO_PI * (ccw ? -1 : 1);
    }

    int seg_n = (int)(ceilf(fabsf(da) / PLUTOVG_HALF_PI));
    if(seg_n == 0)
        return;
    float a = a0;
    float ax = cx + cosf(a) * r;
    float ay = cy + sinf(a) * r;

    float seg_a = da / seg_n;
    float d = (seg_a / PLUTOVG_HALF_PI) * PLUTOVG_KAPPA * r;
    float dx = -sinf(a) * d;
    float dy = cosf(a) * d;

    plutovg_path_reserve(path, 2 + 4 * seg_n);
    if(path->elements.size == 0) {
        plutovg_path_move_to(path, ax, ay);
    } else {
        plutovg_path_line_to(path, ax, ay);
    }

    for(int i = 0; i < seg_n; i++) {
        float cp1x = ax + dx;
        float cp1y = ay + dy;

        a += seg_a;
        ax = cx + cosf(a) * r;
        ay = cy + sinf(a) * r;

        dx = -sinf(a) * d;
        dy = cosf(a) * d;

        float cp2x = ax - dx;
        float cp2y = ay - dy;

        plutovg_path_cubic_to(path, cp1x, cp1y, cp2x, cp2y, ax, ay);
    }
}